

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_AigDfsMap(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x4db,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_24);
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 - pNtk->nBarBufs <= local_24) {
      pAVar3 = Abc_ObjFanin0(pAVar2);
      Abc_AigDfs_rec(pAVar3,vNodes_00);
      Abc_NodeSetTravIdCurrent(pAVar2);
      pAVar3 = Abc_ObjFanout0(pAVar2);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsLatch(Abc_ObjFanout0(pNode))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x4e8,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
      }
      pAVar2 = Abc_ObjFanout0(pAVar2);
      Vec_PtrPush(vNodes_00,pAVar2);
    }
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_24) {
      return vNodes_00;
    }
    pAVar2 = Abc_NtkCo(pNtk,local_24);
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 - pNtk->nBarBufs <= local_24) break;
    pAVar3 = Abc_ObjFanin0(pAVar2);
    Abc_AigDfs_rec(pAVar3,vNodes_00);
    iVar1 = Abc_ObjIsCo(pAVar2);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsCo(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x4f1,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
    }
    Abc_NodeSetTravIdCurrent(pAVar2);
    local_24 = local_24 + 1;
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_AigDfsMap( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // collect cones of barbufs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        // collect latch as a placeholder
        assert( Abc_ObjIsLatch(Abc_ObjFanout0(pNode)) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pNode) );
    }
    // collect nodes of real POs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        assert( Abc_ObjIsCo(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return vNodes;
}